

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

void Pdr_SetPrintStr(Vec_Str_t *vStr,Pdr_Set_t *p,int nRegs,Vec_Int_t *vFlopCounts)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  size_t sVar5;
  int iVar6;
  void *__s;
  char *pcVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  ulong __n;
  int iVar11;
  
  __s = malloc((long)(nRegs + 1));
  if (nRegs < 1) {
    __n = 0;
  }
  else {
    __n = (ulong)(uint)nRegs;
    memset(__s,0x2d,__n);
  }
  *(undefined1 *)((long)__s + __n) = 0;
  iVar11 = p->nLits;
  if (0 < (long)iVar11) {
    lVar8 = 0;
    do {
      uVar1 = *(uint *)(&p->field_0x14 + lVar8 * 4);
      if (uVar1 != 0xffffffff) {
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        *(byte *)((long)__s + (ulong)(uVar1 >> 1)) = (byte)uVar1 & 1 ^ 0x31;
      }
      lVar8 = lVar8 + 1;
    } while (iVar11 != lVar8);
  }
  if (vFlopCounts == (Vec_Int_t *)0x0) {
    iVar11 = 0;
  }
  else {
    iVar2 = vFlopCounts->nSize;
    if ((long)iVar2 < 1) {
      iVar11 = 0;
    }
    else {
      piVar4 = vFlopCounts->pArray;
      lVar8 = 0;
      iVar11 = 0;
      do {
        if (piVar4[lVar8] != 0) {
          lVar9 = (long)iVar11;
          iVar11 = iVar11 + 1;
          *(undefined1 *)((long)__s + lVar9) = *(undefined1 *)((long)__s + lVar8);
        }
        lVar8 = lVar8 + 1;
      } while (iVar2 != lVar8);
    }
    *(undefined1 *)((long)__s + (long)iVar11) = 0;
  }
  iVar3 = vStr->nCap;
  iVar10 = vStr->nSize;
  iVar2 = iVar10 + iVar11;
  if ((iVar3 < iVar2) && (iVar6 = iVar2 * 2, SBORROW4(iVar3,iVar6) != iVar3 + iVar2 * -2 < 0)) {
    if (vStr->pArray == (char *)0x0) {
      pcVar7 = (char *)malloc((long)iVar6);
    }
    else {
      pcVar7 = (char *)realloc(vStr->pArray,(long)iVar6);
      iVar10 = vStr->nSize;
    }
    vStr->pArray = pcVar7;
    vStr->nCap = iVar6;
  }
  memcpy(vStr->pArray + iVar10,__s,(long)iVar11);
  iVar11 = iVar11 + vStr->nSize;
  vStr->nSize = iVar11;
  if (iVar11 == vStr->nCap) {
    if (iVar11 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = 0x10;
    }
    else {
      uVar1 = iVar11 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc((ulong)uVar1);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,(ulong)uVar1);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = uVar1;
    }
  }
  else {
    pcVar7 = vStr->pArray;
  }
  iVar11 = vStr->nSize;
  vStr->nSize = iVar11 + 1;
  pcVar7[iVar11] = ' ';
  uVar1 = vStr->nSize;
  if (uVar1 == vStr->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = 0x10;
    }
    else {
      sVar5 = (ulong)uVar1 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar5);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,sVar5);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = (int)sVar5;
    }
  }
  else {
    pcVar7 = vStr->pArray;
  }
  iVar11 = vStr->nSize;
  vStr->nSize = iVar11 + 1;
  pcVar7[iVar11] = '1';
  uVar1 = vStr->nSize;
  if (uVar1 == vStr->nCap) {
    if ((int)uVar1 < 0x10) {
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(0x10);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,0x10);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = 0x10;
    }
    else {
      sVar5 = (ulong)uVar1 * 2;
      if (vStr->pArray == (char *)0x0) {
        pcVar7 = (char *)malloc(sVar5);
      }
      else {
        pcVar7 = (char *)realloc(vStr->pArray,sVar5);
      }
      vStr->pArray = pcVar7;
      vStr->nCap = (int)sVar5;
    }
  }
  else {
    pcVar7 = vStr->pArray;
  }
  iVar11 = vStr->nSize;
  vStr->nSize = iVar11 + 1;
  pcVar7[iVar11] = '\n';
  if (__s == (void *)0x0) {
    return;
  }
  free(__s);
  return;
}

Assistant:

void Pdr_SetPrintStr( Vec_Str_t * vStr, Pdr_Set_t * p, int nRegs, Vec_Int_t * vFlopCounts )
{
    char * pBuff;
    int i, k = 0, Entry;
    pBuff = ABC_ALLOC( char, nRegs + 1 );
    for ( i = 0; i < nRegs; i++ )
        pBuff[i] = '-';
    pBuff[i] = 0;
    for ( i = 0; i < p->nLits; i++ )
    {
        if ( p->Lits[i] == -1 )
            continue;
        pBuff[Abc_Lit2Var(p->Lits[i])] = (Abc_LitIsCompl(p->Lits[i])? '0':'1');
    }
    if ( vFlopCounts )
    {
        // skip some literals
        Vec_IntForEachEntry( vFlopCounts, Entry, i )
            if ( Entry ) 
                pBuff[k++] = pBuff[i];
        pBuff[k] = 0;
    }
    Vec_StrPushBuffer( vStr, pBuff, k );
    Vec_StrPush( vStr, ' ' );
    Vec_StrPush( vStr, '1' );
    Vec_StrPush( vStr, '\n' );
    ABC_FREE( pBuff );
}